

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

void prvTidyCleanDocument(TidyDocImpl *doc)

{
  TidyDocImpl *doc_local;
  
  CleanTree(doc,&doc->root);
  if ((int)(doc->config).value[0x30].v != 0) {
    DefineStyleRules(doc,&doc->root);
    CreateStyleElement(doc);
  }
  return;
}

Assistant:

void TY_(CleanDocument)( TidyDocImpl* doc )
{
    /* placeholder.  CleanTree()/CleanNode() will not
    ** zap root element 
    */
    CleanTree( doc, &doc->root );

    if ( cfgBool(doc, TidyMakeClean) )
    {
        DefineStyleRules( doc, &doc->root );
        CreateStyleElement( doc );
    }
}